

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,CaseStatement *stmt)

{
  pointer ppEVar1;
  size_t sVar2;
  bool bVar3;
  pointer pIVar4;
  DataFlowState *pDVar5;
  ItemGroup *item;
  pointer pIVar6;
  long lVar7;
  pair<const_slang::ast::Statement_*,_bool> pVar8;
  DataFlowState finalState;
  type initialState;
  DataFlowState *local_370;
  DataFlowState local_350;
  DataFlowState local_2b0;
  DataFlowState local_210;
  DataFlowState local_170;
  DataFlowState local_d0;
  
  ast::Expression::visit<slang::analysis::DataFlowAnalysis&>(stmt->expr,(DataFlowAnalysis *)this);
  pVar8 = ast::CaseStatement::getKnownBranch(stmt,&(this->super_FlowAnalysisBase).evalContext);
  local_370 = &this->state;
  DataFlowState::DataFlowState(&local_2b0,local_370);
  DataFlowAnalysis::unreachableState((DataFlowAnalysis *)this);
  pIVar6 = (stmt->items)._M_ptr;
  pIVar4 = pIVar6 + (stmt->items)._M_extent._M_extent_value;
  for (; pIVar6 != pIVar4; pIVar6 = pIVar6 + 1) {
    if ((((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       (pVar8.first == (pIVar6->stmt).ptr)) {
      DataFlowAnalysis::copyState(&local_d0,(DataFlowAnalysis *)this,&local_2b0);
      pDVar5 = &local_d0;
      setState(this,&local_d0);
      SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
                ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
                 &local_d0,(EVP_PKEY_CTX *)pDVar5);
    }
    else {
      setUnreachable(this);
    }
    ppEVar1 = (pIVar6->expressions)._M_ptr;
    sVar2 = (pIVar6->expressions)._M_extent._M_extent_value;
    for (lVar7 = 0; sVar2 << 3 != lVar7; lVar7 = lVar7 + 8) {
      ast::Expression::visit<slang::analysis::DataFlowAnalysis&>
                (*(Expression **)((long)ppEVar1 + lVar7),(DataFlowAnalysis *)this);
    }
    ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
              ((pIVar6->stmt).ptr,(DataFlowAnalysis *)this);
    DataFlowAnalysis::joinState((DataFlowAnalysis *)this,&local_350,local_370);
  }
  bVar3 = analysis::FlowAnalysisBase::isFullyCovered(&this->super_FlowAnalysisBase,stmt);
  if (stmt->defaultCase == (Statement *)0x0) {
    local_370 = &local_2b0;
    if (bVar3 || ((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_0033207c;
  }
  else {
    if ((byte)(bVar3 | pVar8.second & pVar8.first != stmt->defaultCase) == 1) {
      setUnreachable(this);
    }
    else {
      DataFlowAnalysis::copyState(&local_210,(DataFlowAnalysis *)this,&local_2b0);
      pDVar5 = &local_210;
      setState(this,pDVar5);
      SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
                ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
                 &local_210,(EVP_PKEY_CTX *)pDVar5);
    }
    ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
              (stmt->defaultCase,(DataFlowAnalysis *)this);
  }
  DataFlowAnalysis::joinState((DataFlowAnalysis *)this,&local_350,local_370);
LAB_0033207c:
  pDVar5 = &local_170;
  DataFlowState::DataFlowState(pDVar5,&local_350);
  setState(this,pDVar5);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_170,
             (EVP_PKEY_CTX *)pDVar5);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_350,
             (EVP_PKEY_CTX *)pDVar5);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_2b0,
             (EVP_PKEY_CTX *)pDVar5);
  return;
}

Assistant:

void visitStmt(const CaseStatement& stmt) {
        visit(stmt.expr);

        // If the branch is known we can visit it explicitly,
        // otherwise we need to merge states for all case items.
        // TODO: report warnings from the eval here?
        auto [knownBranch, isKnown] = stmt.getKnownBranch(evalContext);

        auto initialState = std::move(state);
        auto finalState = (DERIVED).unreachableState();

        for (auto& item : stmt.items) {
            if (isKnown && knownBranch != item.stmt)
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            for (auto itemExpr : item.expressions)
                visit(*itemExpr);

            visit(*item.stmt);
            (DERIVED).joinState(finalState, state);
        }

        // Determine whether the case statement has full coverage of all possible
        // inputs, such that we're guaranteed to select one of the case items.
        const bool covered = isFullyCovered(stmt);

        if (stmt.defaultCase) {
            // If the case input is fully covered by item expressions,
            // or if we have a statically known branch that is not the
            // default, then we know the default case is never hit.
            if (covered || (isKnown && knownBranch != stmt.defaultCase))
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            visit(*stmt.defaultCase);
            (DERIVED).joinState(finalState, state);
        }
        else if (!isKnown && !covered) {
            // Branch is not statically known and the case input is
            // not fully covered, so we have to assume that no item
            // may be selected and that the initial state is relevant.
            (DERIVED).joinState(finalState, initialState);
        }

        setState(std::move(finalState));
    }